

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strings.c
# Opt level: O1

size_t str_strlcpy(char *dst,char *src,size_t len)

{
  size_t sVar1;
  
  sVar1 = strlcpy();
  return sVar1;
}

Assistant:

size_t str_strlcpy(char *dst, const char *src, size_t len)
{
#if HAVE_STRLCPY
    return strlcpy(dst, src, len);
#else
    register char *d = dst;
    register const char *s = src;
    register size_t n = len;

    assert(src);
    assert(dst || len==0);
    /* Copy as many bytes as will fit */
    if (n != 0 && --n != 0) {
        do {
            if ((*d++ = *s++) == 0)
                break;
        } while (--n != 0);
    }

    /* Not enough room in dst, add NUL and traverse rest of src */
    if (n == 0) {
        if (len != 0) {
            *d = '\0'; /* NUL-terminate dst */
        }
        return (s - src) + strlen(s); /* count does not include NUL */
    }

    return (s - src - 1);         /* count does not include NUL */
#endif
}